

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.cpp
# Opt level: O3

void __thiscall
ncnn::quantize_pack4to8
          (ncnn *this,float *ptr0,float *ptr1,char *s8ptr,Mat *scale_data,int elemcount)

{
  ncnn *pnVar1;
  float *pfVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ushort uVar14;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  undefined1 auVar16 [16];
  ushort uVar25;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ushort uVar27;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ushort uVar39;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar40 [16];
  short sVar15;
  short sVar26;
  
  if ((int)scale_data < 2) {
    fVar6 = *(float *)s8ptr;
    fVar7 = fVar6;
    fVar8 = fVar6;
    fVar9 = fVar6;
    fVar10 = fVar6;
    fVar11 = fVar6;
    fVar12 = fVar6;
    fVar13 = fVar6;
  }
  else {
    fVar6 = *(float *)s8ptr;
    fVar7 = *(float *)(s8ptr + 4);
    fVar8 = *(float *)(s8ptr + 8);
    fVar9 = *(float *)(s8ptr + 0xc);
    fVar10 = *(float *)(s8ptr + 0x10);
    fVar11 = *(float *)(s8ptr + 0x14);
    fVar12 = *(float *)(s8ptr + 0x18);
    fVar13 = *(float *)(s8ptr + 0x1c);
  }
  uVar3 = 0;
  if (1 < elemcount) {
    uVar3 = elemcount & 0x7ffffffe;
    iVar5 = 1;
    do {
      auVar16._0_4_ =
           (int)((float)((uint)(*(float *)this * fVar6) & 0x80000000 | 0x3f000000) +
                *(float *)this * fVar6);
      auVar16._4_4_ =
           (int)((float)((uint)(*(float *)(this + 4) * fVar7) & 0x80000000 | 0x3f000000) +
                *(float *)(this + 4) * fVar7);
      auVar16._8_4_ =
           (int)((float)((uint)(*(float *)(this + 8) * fVar8) & 0x80000000 | 0x3f000000) +
                *(float *)(this + 8) * fVar8);
      auVar16._12_4_ =
           (int)((float)((uint)(*(float *)(this + 0xc) * fVar9) & 0x80000000 | 0x3f000000) +
                *(float *)(this + 0xc) * fVar9);
      auVar28._0_4_ =
           (int)((float)((uint)(*ptr0 * fVar10) & 0x80000000 | 0x3f000000) + *ptr0 * fVar10);
      auVar28._4_4_ =
           (int)((float)((uint)(ptr0[1] * fVar11) & 0x80000000 | 0x3f000000) + ptr0[1] * fVar11);
      auVar28._8_4_ =
           (int)((float)((uint)(ptr0[2] * fVar12) & 0x80000000 | 0x3f000000) + ptr0[2] * fVar12);
      auVar28._12_4_ =
           (int)((float)((uint)(ptr0[3] * fVar13) & 0x80000000 | 0x3f000000) + ptr0[3] * fVar13);
      auVar16 = packssdw(auVar16,auVar28);
      auVar29._0_4_ =
           (int)((float)((uint)(*(float *)(this + 0x10) * fVar6) & 0x80000000 | 0x3f000000) +
                *(float *)(this + 0x10) * fVar6);
      auVar29._4_4_ =
           (int)((float)((uint)(*(float *)(this + 0x14) * fVar7) & 0x80000000 | 0x3f000000) +
                *(float *)(this + 0x14) * fVar7);
      auVar29._8_4_ =
           (int)((float)((uint)(*(float *)(this + 0x18) * fVar8) & 0x80000000 | 0x3f000000) +
                *(float *)(this + 0x18) * fVar8);
      auVar29._12_4_ =
           (int)((float)((uint)(*(float *)(this + 0x1c) * fVar9) & 0x80000000 | 0x3f000000) +
                *(float *)(this + 0x1c) * fVar9);
      auVar40._0_4_ =
           (int)((float)((uint)(ptr0[4] * fVar10) & 0x80000000 | 0x3f000000) + ptr0[4] * fVar10);
      auVar40._4_4_ =
           (int)((float)((uint)(ptr0[5] * fVar11) & 0x80000000 | 0x3f000000) + ptr0[5] * fVar11);
      auVar40._8_4_ =
           (int)((float)((uint)(ptr0[6] * fVar12) & 0x80000000 | 0x3f000000) + ptr0[6] * fVar12);
      auVar40._12_4_ =
           (int)((float)((uint)(ptr0[7] * fVar13) & 0x80000000 | 0x3f000000) + ptr0[7] * fVar13);
      auVar30 = packssdw(auVar29,auVar40);
      sVar15 = auVar16._0_2_;
      uVar14 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar16._2_2_;
      uVar19 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar16._4_2_;
      uVar20 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar16._6_2_;
      uVar21 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar16._8_2_;
      uVar22 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar16._10_2_;
      uVar23 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar16._12_2_;
      sVar26 = auVar16._14_2_;
      uVar24 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      uVar25 = (ushort)(0x7f < sVar26) * 0x7f | (ushort)(0x7f >= sVar26) * sVar26;
      sVar15 = auVar30._0_2_;
      uVar27 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar30._2_2_;
      uVar33 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar30._4_2_;
      uVar34 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar30._6_2_;
      uVar35 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar30._8_2_;
      uVar36 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar30._10_2_;
      uVar37 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar30._12_2_;
      sVar26 = auVar30._14_2_;
      uVar38 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      uVar39 = (ushort)(0x7f < sVar26) * 0x7f | (ushort)(0x7f >= sVar26) * sVar26;
      auVar30._0_2_ = (ushort)((short)uVar14 < -0x7f) * -0x7f | ((short)uVar14 >= -0x7f) * uVar14;
      auVar30._2_2_ = (ushort)((short)uVar19 < -0x7f) * -0x7f | ((short)uVar19 >= -0x7f) * uVar19;
      auVar30._4_2_ = (ushort)((short)uVar20 < -0x7f) * -0x7f | ((short)uVar20 >= -0x7f) * uVar20;
      auVar30._6_2_ = (ushort)((short)uVar21 < -0x7f) * -0x7f | ((short)uVar21 >= -0x7f) * uVar21;
      auVar30._8_2_ = (ushort)((short)uVar22 < -0x7f) * -0x7f | ((short)uVar22 >= -0x7f) * uVar22;
      auVar30._10_2_ = (ushort)((short)uVar23 < -0x7f) * -0x7f | ((short)uVar23 >= -0x7f) * uVar23;
      auVar30._12_2_ = (ushort)((short)uVar24 < -0x7f) * -0x7f | ((short)uVar24 >= -0x7f) * uVar24;
      auVar30._14_2_ = (ushort)((short)uVar25 < -0x7f) * -0x7f | ((short)uVar25 >= -0x7f) * uVar25;
      auVar31._0_2_ = (ushort)((short)uVar27 < -0x7f) * -0x7f | ((short)uVar27 >= -0x7f) * uVar27;
      auVar31._2_2_ = (ushort)((short)uVar33 < -0x7f) * -0x7f | ((short)uVar33 >= -0x7f) * uVar33;
      auVar31._4_2_ = (ushort)((short)uVar34 < -0x7f) * -0x7f | ((short)uVar34 >= -0x7f) * uVar34;
      auVar31._6_2_ = (ushort)((short)uVar35 < -0x7f) * -0x7f | ((short)uVar35 >= -0x7f) * uVar35;
      auVar31._8_2_ = (ushort)((short)uVar36 < -0x7f) * -0x7f | ((short)uVar36 >= -0x7f) * uVar36;
      auVar31._10_2_ = (ushort)((short)uVar37 < -0x7f) * -0x7f | ((short)uVar37 >= -0x7f) * uVar37;
      auVar31._12_2_ = (ushort)((short)uVar38 < -0x7f) * -0x7f | ((short)uVar38 >= -0x7f) * uVar38;
      auVar31._14_2_ = (ushort)((short)uVar39 < -0x7f) * -0x7f | ((short)uVar39 >= -0x7f) * uVar39;
      auVar16 = packsswb(auVar30,auVar31);
      *(undefined1 (*) [16])ptr1 = auVar16;
      this = this + 0x20;
      ptr0 = ptr0 + 8;
      ptr1 = (float *)((long)ptr1 + 0x10);
      iVar5 = iVar5 + 2;
    } while (iVar5 < elemcount);
  }
  iVar5 = elemcount - uVar3;
  if (iVar5 != 0 && (int)uVar3 <= elemcount) {
    lVar4 = 0;
    do {
      pnVar1 = this + lVar4 * 2;
      pfVar2 = (float *)((long)ptr0 + lVar4 * 2);
      auVar17._0_4_ =
           (int)((float)((uint)(*(float *)pnVar1 * fVar6) & 0x80000000 | 0x3f000000) +
                *(float *)pnVar1 * fVar6);
      auVar17._4_4_ =
           (int)((float)((uint)(*(float *)(pnVar1 + 4) * fVar7) & 0x80000000 | 0x3f000000) +
                *(float *)(pnVar1 + 4) * fVar7);
      auVar17._8_4_ =
           (int)((float)((uint)(*(float *)(pnVar1 + 8) * fVar8) & 0x80000000 | 0x3f000000) +
                *(float *)(pnVar1 + 8) * fVar8);
      auVar17._12_4_ =
           (int)((float)((uint)(*(float *)(pnVar1 + 0xc) * fVar9) & 0x80000000 | 0x3f000000) +
                *(float *)(pnVar1 + 0xc) * fVar9);
      auVar32._0_4_ =
           (int)((float)((uint)(*pfVar2 * fVar10) & 0x80000000 | 0x3f000000) + *pfVar2 * fVar10);
      auVar32._4_4_ =
           (int)((float)((uint)(pfVar2[1] * fVar11) & 0x80000000 | 0x3f000000) + pfVar2[1] * fVar11)
      ;
      auVar32._8_4_ =
           (int)((float)((uint)(pfVar2[2] * fVar12) & 0x80000000 | 0x3f000000) + pfVar2[2] * fVar12)
      ;
      auVar32._12_4_ =
           (int)((float)((uint)(pfVar2[3] * fVar13) & 0x80000000 | 0x3f000000) + pfVar2[3] * fVar13)
      ;
      auVar16 = packssdw(auVar17,auVar32);
      sVar15 = auVar16._0_2_;
      uVar14 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar16._2_2_;
      uVar19 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar16._4_2_;
      uVar20 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar16._6_2_;
      uVar21 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar16._8_2_;
      uVar22 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar16._10_2_;
      uVar23 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      sVar15 = auVar16._12_2_;
      sVar26 = auVar16._14_2_;
      uVar24 = (ushort)(0x7f < sVar15) * 0x7f | (ushort)(0x7f >= sVar15) * sVar15;
      uVar25 = (ushort)(0x7f < sVar26) * 0x7f | (ushort)(0x7f >= sVar26) * sVar26;
      auVar18._0_2_ = (ushort)((short)uVar14 < -0x7f) * -0x7f | ((short)uVar14 >= -0x7f) * uVar14;
      auVar18._2_2_ = (ushort)((short)uVar19 < -0x7f) * -0x7f | ((short)uVar19 >= -0x7f) * uVar19;
      auVar18._4_2_ = (ushort)((short)uVar20 < -0x7f) * -0x7f | ((short)uVar20 >= -0x7f) * uVar20;
      auVar18._6_2_ = (ushort)((short)uVar21 < -0x7f) * -0x7f | ((short)uVar21 >= -0x7f) * uVar21;
      auVar18._8_2_ = (ushort)((short)uVar22 < -0x7f) * -0x7f | ((short)uVar22 >= -0x7f) * uVar22;
      auVar18._10_2_ = (ushort)((short)uVar23 < -0x7f) * -0x7f | ((short)uVar23 >= -0x7f) * uVar23;
      auVar18._12_2_ = (ushort)((short)uVar24 < -0x7f) * -0x7f | ((short)uVar24 >= -0x7f) * uVar24;
      auVar18._14_2_ = (ushort)((short)uVar25 < -0x7f) * -0x7f | ((short)uVar25 >= -0x7f) * uVar25;
      auVar16 = packsswb(auVar18,auVar18);
      *(long *)((long)*(undefined1 (*) [16])ptr1 + lVar4) = auVar16._0_8_;
      lVar4 = lVar4 + 8;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  return;
}

Assistant:

static void quantize_pack4to8(const float* ptr0, const float* ptr1, signed char* s8ptr, const Mat& scale_data, int elemcount)
{
    const int scale_data_size = scale_data.w;

    // NCNN_LOGE("quantize_pack4to8 %d   %d", scale_data_size, elemcount);

    float scale = scale_data[0];
    __m128 _scale0 = _mm_set1_ps(scale);
    __m128 _scale1 = _scale0;
    if (scale_data_size > 1)
    {
        _scale0 = _mm_loadu_ps((const float*)scale_data);
        _scale1 = _mm_loadu_ps((const float*)scale_data + 4);
    }

    int i = 0;
    for (; i + 1 < elemcount; i += 2)
    {
        __m128 _v0 = _mm_loadu_ps(ptr0);
        __m128 _v1 = _mm_loadu_ps(ptr1);
        __m128 _v2 = _mm_loadu_ps(ptr0 + 4);
        __m128 _v3 = _mm_loadu_ps(ptr1 + 4);
        _v0 = _mm_mul_ps(_v0, _scale0);
        _v1 = _mm_mul_ps(_v1, _scale1);
        _v2 = _mm_mul_ps(_v2, _scale0);
        _v3 = _mm_mul_ps(_v3, _scale1);
        _mm_storeu_si128((__m128i*)s8ptr, float2int8_sse(_v0, _v1, _v2, _v3));
        ptr0 += 8;
        ptr1 += 8;
        s8ptr += 16;
    }
    for (; i < elemcount; i++)
    {
        __m128 _v0 = _mm_loadu_ps(ptr0);
        __m128 _v1 = _mm_loadu_ps(ptr1);
        _v0 = _mm_mul_ps(_v0, _scale0);
        _v1 = _mm_mul_ps(_v1, _scale1);
        *(int64_t*)s8ptr = float2int8_sse(_v0, _v1);
        ptr0 += 4;
        ptr1 += 4;
        s8ptr += 8;
    }
}